

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

void duckdb::ReadDataFromVarcharSegment
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  ulong *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  idx_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Vector *vector;
  byte bVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  data_ptr_t pdVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  InternalException *this_00;
  uint *puVar9;
  idx_t len;
  char *pcVar10;
  ulong uVar11;
  Vector *pVVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  string local_88;
  buffer_ptr<ValidityBuffer> *local_60;
  long local_58;
  data_ptr_t local_50;
  char *local_48;
  long local_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  if (segment->count != 0) {
    local_50 = result->data;
    local_58 = (long)&segment[1].count + (ulong)segment->capacity;
    lVar13 = *(long *)((long)&segment[1].next + (ulong)segment->capacity * 9);
    local_60 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar11 = 0;
    len = 0;
    do {
      pdVar7 = local_50;
      iVar3 = *total_count;
      if (*(char *)((long)&segment[1].count + len) == '\x01') {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_88,&local_38);
          sVar6 = local_88._M_string_length;
          _Var5._M_p = local_88._M_dataplus._M_p;
          local_88._M_dataplus._M_p = (pointer)0x0;
          local_88._M_string_length = 0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var5._M_p;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_60);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar4 = (byte)(iVar3 + len) & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (iVar3 + len >> 6);
        *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      else {
        lVar14 = len * 0x10;
        vector = *(Vector **)(local_58 + len * 8);
        aVar16 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)result,vector,len);
        paVar2 = (anon_union_16_2_67f50693_for_value *)(pdVar7 + lVar14 + iVar3 * 0x10);
        local_48 = (paVar2->pointer).prefix;
        paVar2->pointer = aVar16;
        pcVar10 = aVar16.ptr;
        if (aVar16.length < 0xd) {
          pcVar10 = local_48;
        }
        local_40 = lVar14;
        if (vector != (Vector *)0x0) {
          pVVar12 = (Vector *)0x0;
          do {
            if (lVar13 == 0) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,"Insufficient data to read string","");
              InternalException::InternalException(this_00,&local_88);
              __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar15 = *(ushort *)(lVar13 + 2) - uVar11;
            if ((ulong)((long)vector - (long)pVVar12) < uVar15) {
              uVar15 = (long)vector - (long)pVVar12;
            }
            switchD_012dd528::default
                      (pcVar10 + (long)pVVar12,(void *)(lVar13 + uVar11 + 0x10),uVar15);
            uVar11 = uVar11 + uVar15;
            if (*(ushort *)(lVar13 + 2) <= uVar11) {
              lVar13 = *(long *)(lVar13 + 8);
              uVar11 = 0;
            }
            pVVar12 = (Vector *)(&pVVar12->vector_type + uVar15);
          } while (pVVar12 < vector);
        }
        puVar9 = (uint *)(pdVar7 + local_40 + iVar3 * 0x10);
        uVar15 = (ulong)*puVar9;
        if (uVar15 < 0xd) {
          switchD_01306cb1::default(local_48 + uVar15,0,0xc - uVar15);
        }
        else {
          puVar9[1] = **(uint **)(puVar9 + 2);
        }
      }
      len = len + 1;
    } while (len < segment->count);
  }
  return;
}

Assistant:

static void ReadDataFromVarcharSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                       idx_t &total_count) {
	auto &aggr_vector_validity = FlatVector::Validity(result);

	// use length and (reconstructed) offset to get the correct substrings
	auto aggr_vector_data = FlatVector::GetData<string_t>(result);
	auto str_length_data = GetListLengthData(segment);

	auto null_mask = GetNullMask(segment);
	auto linked_child_list = Load<LinkedList>(const_data_ptr_cast(GetListChildData(segment)));
	auto current_segment = linked_child_list.first_segment;
	idx_t child_offset = 0;
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			// set to null
			aggr_vector_validity.SetInvalid(total_count + i);
			continue;
		}
		// read the string
		auto &result_str = aggr_vector_data[total_count + i];
		auto str_length = Load<uint64_t>(const_data_ptr_cast(str_length_data + i));
		// allocate an empty string for the given size
		result_str = StringVector::EmptyString(result, str_length);
		auto result_data = result_str.GetDataWriteable();
		// copy over the data
		idx_t current_offset = 0;
		while (current_offset < str_length) {
			if (!current_segment) {
				throw InternalException("Insufficient data to read string");
			}
			auto child_data = GetStringData(current_segment);
			idx_t max_copy = MinValue<idx_t>(str_length - current_offset, current_segment->capacity - child_offset);
			memcpy(result_data + current_offset, child_data + child_offset, max_copy);
			current_offset += max_copy;
			child_offset += max_copy;
			if (child_offset >= current_segment->capacity) {
				D_ASSERT(child_offset == current_segment->capacity);
				current_segment = current_segment->next;
				child_offset = 0;
			}
		}

		// finalize the str
		result_str.Finalize();
	}
}